

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnceReduction.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_22::Scanner::~Scanner(Scanner *this)

{
  Scanner *this_local;
  
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__Scanner_0309e078;
  std::
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  ::~unordered_map(&this->readGlobals);
  WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
  ::~WalkerPass(&this->
                 super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
               );
  return;
}

Assistant:

bool modifiesBinaryenIR() override { return false; }